

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_shrinkToFit_failure_growStrategyNull_fn(int _i)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  size_t *psVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  size_t local_68;
  char *local_60;
  undefined1 local_58 [16];
  code *local_48;
  code *pcStack_40;
  long local_38;
  long local_30;
  size_t local_28;
  void *local_20;
  long lVar14;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 7;
  local_58._8_8_ = 0x10cec9;
  local_28 = private_ACUtils_ADynArray_growStrategyGeneric(9,8,0x20,2.0,0x20);
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_58._8_8_ = 0x10cedf;
  local_20 = private_ACUtilsTest_ADynArray_realloc((void *)0x0,local_28);
  auVar1 = _DAT_00157020;
  lVar5 = 1;
  auVar13 = _DAT_00157010;
  do {
    if (SUB164(auVar13 ^ auVar1,4) == -0x80000000 && SUB164(auVar13 ^ auVar1,0) < -0x7ffffffa) {
      *(undefined1 *)((long)local_20 + lVar5 + -1) = 0x35;
      *(undefined1 *)((long)local_20 + lVar5) = 0x35;
    }
    lVar14 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 2;
    auVar13._8_8_ = lVar14 + 2;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 7);
  *(undefined1 *)((long)local_20 + 6) = 0x30;
  local_38 = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  local_58._8_8_ = 0x10cf73;
  bVar3 = private_ACUtils_ADynArray_shrinkToFit(&local_48,1);
  if (bVar3 != false) {
    local_68 = (size_t)bVar3;
    psVar9 = &local_68;
    local_60 = "false";
    pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar11 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer)) == false";
    pcVar12 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer))";
    iVar10 = 0x1bf;
LAB_0010d298:
    local_58 = (undefined1  [16])0x0;
    *(code **)((long)psVar9 + -8) = test_ADynArray_shrinkToFit_failure_nullptr_fn;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,iVar10,pcVar7,pcVar6,pcVar11,pcVar12);
  }
  local_58._8_8_ = 0x10cf8c;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x1bf);
  if (local_30 == 7) {
    local_58._8_8_ = 0x10cfac;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1c0);
    sVar2 = local_28;
    local_58._8_8_ = 0x10cfd2;
    sVar4 = private_ACUtils_ADynArray_growStrategyGeneric(9,8,0x20,2.0,0x20);
    if (sVar2 != sVar4) {
      local_58._8_8_ = 0;
      local_58._0_8_ = sVar4;
      local_60 = 
      "private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char))"
      ;
      local_68 = sVar2;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x1c1,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "array.capacity == private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char))"
                        ,"array.capacity");
    }
    local_58._8_8_ = 0x10cfec;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1c1);
    if (local_20 == (void *)0x0) {
      psVar9 = (size_t *)local_58;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar6 = "Assertion \'%s\' failed: %s == %#x";
      pcVar11 = "(void*) array.buffer != NULL";
      pcVar12 = "(void*) array.buffer";
      iVar10 = 0x1c2;
      goto LAB_0010d298;
    }
    local_58._8_8_ = 0x10d00c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x1c2);
    lVar5 = 0;
    do {
      if ((long)*(char *)((long)local_20 + lVar5) != 0x35) {
        local_60 = "\'5\'";
        pcVar6 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar7 = "array.buffer[i] == \'5\'";
        pcVar11 = "array.buffer[i]";
        iVar10 = 0x1c4;
        local_58 = ZEXT816(0x35);
        lVar5 = (long)*(char *)((long)local_20 + lVar5);
        goto LAB_0010d0e4;
      }
      local_58._8_8_ = 0x10d030;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x1c4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    if ((long)*(char *)((long)local_20 + 6) == 0x30) {
      local_58._8_8_ = 0x10d05e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x1c5);
      if (local_38 == 0) {
        local_58._8_8_ = 0x10d07d;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x1c6);
        if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
          local_58._8_8_ = 0x10d09e;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x1c7);
          local_58._8_8_ = 0x10d0a7;
          (*pcStack_40)(local_20);
          return;
        }
        psVar9 = &local_68;
        local_60 = "0";
        local_68 = private_ACUtilsTest_ADynArray_reallocCount;
        pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar11 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
        pcVar12 = "private_ACUtilsTest_ADynArray_reallocCount";
        iVar10 = 0x1c7;
        goto LAB_0010d298;
      }
      pcVar12 = "Assertion \'_ck_x == NULL\' failed";
      pcVar6 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) array.growStrategy == NULL";
      pcVar11 = "(void*) array.growStrategy";
      iVar10 = 0x1c6;
      ppcVar8 = (char **)(local_58 + 8);
      local_58._8_8_ = 0;
      lVar5 = local_38;
      goto LAB_0010d0e6;
    }
    local_60 = "\'0\'";
    pcVar6 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar7 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2] == \'0\'";
    pcVar11 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2]";
    iVar10 = 0x1c5;
    local_58 = ZEXT816(0x30);
    lVar5 = (long)*(char *)((long)local_20 + 6);
  }
  else {
    local_60 = "private_ACUtilsTest_ADynArray_capacityMin - 1";
    pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = "array.size == private_ACUtilsTest_ADynArray_capacityMin - 1";
    pcVar11 = "array.size";
    iVar10 = 0x1c0;
    local_58 = ZEXT816(7);
    lVar5 = local_30;
  }
LAB_0010d0e4:
  pcVar12 = "Assertion \'_ck_x == _ck_y\' failed";
  ppcVar8 = &local_60;
LAB_0010d0e6:
  *(long *)((long)ppcVar8 + -8) = lVar5;
  *(undefined8 *)((long)ppcVar8 + -0x10) = 0x10d0ed;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar10,pcVar12,pcVar6,pcVar7,pcVar11);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_shrinkToFit_failure_growStrategyNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin - 1;
    array.capacity = private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char));
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    array.growStrategy = nullptr;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_shrinkToFit(&array), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin - 1);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char)));
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 2; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}